

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec_test.cpp
# Opt level: O3

void test_single<unsigned_long_long>(void)

{
  write_int_to_stream<unsigned_long_long> wVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *this;
  bool bVar4;
  ostringstream oss;
  ostringstream a;
  ostringstream b;
  write_int_to_stream<unsigned_long_long> local_4f0;
  size_t local_4e8;
  char local_4e0 [16];
  write_int_to_stream<unsigned_long_long> local_4d0;
  write_int_to_stream<unsigned_long_long> local_4c8;
  write_int_to_stream<unsigned_long_long> local_4c0;
  write_int_to_stream<unsigned_long_long> local_4b8;
  write_int_to_stream<unsigned_long_long> local_4b0;
  write_int_to_stream<unsigned_long_long> local_4a8;
  write_int_to_stream<unsigned_long_long> local_4a0;
  write_int_to_stream<unsigned_long_long> local_498;
  size_t local_490;
  char local_488 [360];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_498.v = 0;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_498,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4f0.v = 0xffffffffffffffff;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_4f0,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4a0.v = 1;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_4a0,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4a8.v = 0;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_4a8,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4b0.v = 0xffffffffffffffff;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_4b0,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4b8.v = 10;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_4b8,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4c0.v = 0xfffffffffffffff6;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_4c0,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4c8.v = 0x3039;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_4c8,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4d0.v = 0xffffffffffffcfc7;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            (&local_4d0,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  wVar1.v = local_4f0.v;
  if (local_490 == local_4e8) {
    if (local_490 == 0) {
      bVar4 = false;
    }
    else {
      iVar2 = bcmp((void *)local_498.v,(void *)local_4f0.v,local_490);
      bVar4 = iVar2 != 0;
    }
  }
  else {
    bVar4 = true;
  }
  if ((char *)wVar1.v != local_4e0) {
    operator_delete((void *)wVar1.v);
  }
  if ((char *)local_498.v != local_488) {
    operator_delete((void *)local_498.v);
  }
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error!!! \n   ",0xd);
    std::__cxx11::stringbuf::str();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_498.v,local_490);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n   ",4);
    std::__cxx11::stringbuf::str();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_4f0.v,local_4e8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((char *)local_4f0.v != local_4e0) {
      operator_delete((void *)local_4f0.v);
    }
    if ((char *)local_498.v != local_488) {
      operator_delete((void *)local_498.v);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    wVar1.v = local_4f0.v;
    if (local_490 == local_4e8) {
      if (local_490 == 0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp((void *)local_498.v,(void *)local_4f0.v,local_490);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if ((char *)wVar1.v != local_4e0) {
      operator_delete((void *)wVar1.v);
    }
    if ((char *)local_498.v != local_488) {
      operator_delete((void *)local_498.v);
    }
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_498,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/todec_test.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,":",1);
      poVar3 = (ostream *)std::ostream::operator<<(&local_498,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," a.str() == b.str()",0x13);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this,(string *)&local_4f0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok       \n   ",0xd);
    std::__cxx11::stringbuf::str();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_498.v,local_490);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n   ",4);
    std::__cxx11::stringbuf::str();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_4f0.v,local_4e8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((char *)local_4f0.v != local_4e0) {
      operator_delete((void *)local_4f0.v);
    }
    if ((char *)local_498.v != local_488) {
      operator_delete((void *)local_498.v);
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void test_single()
{
	using cppcms::impl::cint;
	std::ostringstream a,b;
	a 	<< cint(std::numeric_limits<T>::min()) << " " 
		<< cint(std::numeric_limits<T>::max()) << " " 
		<< cint(T(1)) << " "
		<< cint(T(0)) << " "
		<< cint(T(-1)) << " "
		<< cint(T(10)) << " "
		<< cint(T(-10)) << " "
		<< cint(T(12345)) << " "
		<< cint(T(-12345)) << " ";
	b	<< (std::numeric_limits<T>::min()) << " " 
		<< (std::numeric_limits<T>::max()) << " " 
		<< (T(1)) << " "
		<< (T(0)) << " "
		<< (T(-1)) << " "
		<< (T(10)) << " "
		<< (T(-10)) << " "
		<< (T(12345)) << " "
		<< (T(-12345)) << " ";
	if(a.str()!=b.str()) {
		std::cerr << "Error!!! \n   " << a.str() << "\n   " << b.str() << std::endl;
		TEST(a.str() == b.str());
	}
	else {
		std::cout << "Ok       \n   " << a.str() << "\n   " << b.str() << std::endl;
	}
}